

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_eval.cc
# Opt level: O0

void EXPLORE_EVAL::finish(explore_eval *data)

{
  ostream *poVar1;
  void *pvVar2;
  long in_RDI;
  
  if ((*(byte *)(*(long *)(in_RDI + 0x10) + 0x3439) & 1) == 0) {
    poVar1 = std::operator<<((ostream *)(*(long *)(in_RDI + 0x10) + 0xe0),"update count = ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,*(ulong *)(in_RDI + 0x68));
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    if (*(long *)(in_RDI + 0x70) != 0) {
      poVar1 = std::operator<<((ostream *)(*(long *)(in_RDI + 0x10) + 0xe0),"violation count = ");
      pvVar2 = (void *)std::ostream::operator<<(poVar1,*(ulong *)(in_RDI + 0x70));
      std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    }
    if ((*(byte *)(in_RDI + 0x7c) & 1) == 0) {
      poVar1 = std::operator<<((ostream *)(*(long *)(in_RDI + 0x10) + 0xe0),"final multiplier = ");
      pvVar2 = (void *)std::ostream::operator<<(poVar1,*(float *)(in_RDI + 0x78));
      std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void finish(explore_eval& data)
{
  if (!data.all->quiet)
  {
    data.all->trace_message << "update count = " << data.update_count << endl;
    if (data.violations > 0)
      data.all->trace_message << "violation count = " << data.violations << endl;
    if (!data.fixed_multiplier)
      data.all->trace_message << "final multiplier = " << data.multiplier << endl;
  }
}